

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbtree.c
# Opt level: O0

rb_result_t rb_tree_remove(rb_tree *tree,rb_tree_node *node)

{
  int iVar1;
  rb_tree_node *prVar2;
  bool bVar3;
  int y_color;
  rb_tree_node *yp;
  rb_tree_node *prStack_38;
  int is_left;
  rb_tree_node *xp;
  rb_tree_node *x;
  rb_tree_node *y;
  rb_result_t ret;
  rb_tree_node *node_local;
  rb_tree *tree_local;
  
  if (tree == (rb_tree *)0x0) {
    __assert_fail("\"tree != NULL\" && 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/deps/rbtree/rbtree.c"
                  ,0x2ad,"rb_result_t rb_tree_remove(struct rb_tree *, struct rb_tree_node *)");
  }
  if (node != (rb_tree_node *)0x0) {
    if ((node->left == (rb_tree_node *)0x0) || (node->right == (rb_tree_node *)0x0)) {
      x = node;
      if (node == tree->rightmost) {
        prVar2 = __helper_rb_tree_find_predecessor(node);
        tree->rightmost = prVar2;
      }
    }
    else {
      x = __helper_rb_tree_find_successor(node);
    }
    if (x->left == (rb_tree_node *)0x0) {
      xp = x->right;
    }
    else {
      xp = x->left;
    }
    if (xp == (rb_tree_node *)0x0) {
      prStack_38 = x->parent;
    }
    else {
      xp->parent = x->parent;
      prStack_38 = xp->parent;
    }
    yp._4_4_ = 0;
    if (x->parent == (rb_tree_node *)0x0) {
      tree->root = xp;
      prStack_38 = (rb_tree_node *)0x0;
    }
    else {
      prVar2 = x->parent;
      bVar3 = x != prVar2->left;
      if (bVar3) {
        prVar2->right = xp;
      }
      else {
        prVar2->left = xp;
      }
      yp._4_4_ = (uint)!bVar3;
    }
    iVar1 = x->color;
    if ((x != node) && (__helper_rb_tree_swap_node(tree,node,x), prStack_38 == node)) {
      prStack_38 = x;
    }
    if (iVar1 == 0) {
      __helper_rb_tree_delete_rebalance(tree,xp,prStack_38,yp._4_4_);
    }
    node->parent = (rb_tree_node *)0x0;
    node->left = (rb_tree_node *)0x0;
    node->right = (rb_tree_node *)0x0;
    return 0;
  }
  __assert_fail("\"node != NULL\" && 0",
                "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/deps/rbtree/rbtree.c"
                ,0x2ae,"rb_result_t rb_tree_remove(struct rb_tree *, struct rb_tree_node *)");
}

Assistant:

rb_result_t rb_tree_remove(struct rb_tree *tree,
                           struct rb_tree_node *node)
{
    rb_result_t ret = RB_OK;

    RB_ASSERT_ARG(tree != NULL);
    RB_ASSERT_ARG(node != NULL);

    struct rb_tree_node *y;


    if (node->left == NULL || node->right == NULL) {
        y = node;
        if (node == tree->rightmost) {
            /* The new rightmost item is our successor */
            tree->rightmost = __helper_rb_tree_find_predecessor(node);
        }
    } else {
        y = __helper_rb_tree_find_successor(node);
    }

    struct rb_tree_node *x, *xp;

    if (y->left != NULL) {
        x = y->left;
    } else {
        x = y->right;
    }

    if (x != NULL) {
        x->parent = y->parent;
        xp = x->parent;
    } else {
        xp = y->parent;
    }

    int is_left = 0;
    if (y->parent == NULL) {
        tree->root = x;
        xp = NULL;
    } else {
        struct rb_tree_node *yp = y->parent;
        if (y == yp->left) {
            yp->left = x;
            is_left = 1;
        } else {
            yp->right = x;
            is_left = 0;
        }
    }

    int y_color = y->color;

    /* Swap in the node */
    if (y != node) {
        __helper_rb_tree_swap_node(tree, node, y);
        if (xp == node) {
            xp = y;
        }
    }

    if (y_color == COLOR_BLACK) {
        __helper_rb_tree_delete_rebalance(tree, x, xp, is_left);
    }

    node->parent = NULL;
    node->left = NULL;
    node->right = NULL;

    return ret;
}